

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall argparse::Argument::default_value<bool>(Argument *this,bool *value)

{
  size_t maximum;
  string local_68;
  string local_48;
  NArgsRange local_28;
  bool *local_18;
  bool *value_local;
  Argument *this_local;
  
  local_18 = value;
  value_local = (bool *)this;
  maximum = NArgsRange::get_max(&this->m_num_args_range);
  NArgsRange::NArgsRange(&local_28,0,maximum);
  (this->m_num_args_range).m_min = local_28.m_min;
  (this->m_num_args_range).m_max = local_28.m_max;
  details::repr<bool>(&local_48,local_18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_default_value_repr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::to_string(&local_68,(uint)(*local_18 & 1));
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->m_default_value_str,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::any::operator=(&this->m_default_value,local_18);
  return this;
}

Assistant:

Argument &default_value(T &&value) {
    m_num_args_range = NArgsRange{0, m_num_args_range.get_max()};
    m_default_value_repr = details::repr(value);

    if constexpr (std::is_convertible_v<T, std::string_view>) {
      m_default_value_str = std::string{std::string_view{value}};
    } else if constexpr (details::can_invoke_to_string<T>::value) {
      m_default_value_str = std::to_string(value);
    }

    m_default_value = std::forward<T>(value);
    return *this;
  }